

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

void Vec_WrdFillExtra(Vec_Wrd_t *p,int nSize,word Fill)

{
  int iVar1;
  uint uVar2;
  word *pwVar3;
  int iVar4;
  
  if (nSize <= p->nSize) {
    return;
  }
  iVar1 = p->nCap;
  iVar4 = iVar1 * 2;
  if (iVar4 < nSize) {
    if (nSize <= iVar1) goto LAB_00428efb;
    if (p->pArray == (word *)0x0) {
      pwVar3 = (word *)malloc((long)nSize << 3);
    }
    else {
      pwVar3 = (word *)realloc(p->pArray,(long)nSize << 3);
    }
    p->pArray = pwVar3;
    iVar4 = nSize;
  }
  else {
    if (iVar4 <= iVar1 || nSize <= iVar1) goto LAB_00428efb;
    if (p->pArray == (word *)0x0) {
      pwVar3 = (word *)malloc((long)iVar1 << 4);
    }
    else {
      pwVar3 = (word *)realloc(p->pArray,(long)iVar1 << 4);
    }
    p->pArray = pwVar3;
  }
  if (pwVar3 == (word *)0x0) {
    __assert_fail("p->pArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
  }
  p->nCap = iVar4;
LAB_00428efb:
  uVar2 = p->nSize;
  if ((int)uVar2 < nSize) {
    memset(p->pArray + (int)uVar2,0,(ulong)(~uVar2 + nSize) * 8 + 8);
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_WrdFillExtra( Vec_Wrd_t * p, int nSize, word Fill )
{
    int i;
    if ( nSize <= p->nSize )
        return;
    if ( nSize > 2 * p->nCap )
        Vec_WrdGrow( p, nSize );
    else if ( nSize > p->nCap )
        Vec_WrdGrow( p, 2 * p->nCap );
    for ( i = p->nSize; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}